

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimpleDataCacheWrapper.cpp
# Opt level: O1

HRESULT __thiscall
Js::SimpleDataCacheWrapper::SeekReadStreamToBlock
          (SimpleDataCacheWrapper *this,BlockType blockType,ULONG *bytesInBlock)

{
  int iVar1;
  HRESULT HVar2;
  
  if (bytesInBlock != (ULONG *)0x0) {
    *bytesInBlock = 0;
  }
  iVar1 = -0x7fffbffb;
  if ((this->inStream).ptr == (IStream *)0x0) {
    iVar1 = ReadHeader(this);
  }
  if (-1 < iVar1) {
    HVar2 = SeekReadStreamToBlockHelper(this,blockType,bytesInBlock);
    return HVar2;
  }
  return iVar1;
}

Assistant:

HRESULT SimpleDataCacheWrapper::SeekReadStreamToBlock(_In_ BlockType blockType, _Out_opt_ ULONG* bytesInBlock)
    {
        HRESULT hr;

        if (bytesInBlock != nullptr)
        {
            *bytesInBlock = 0;
        }

        IFFAILRET(ResetReadStream());

        // Reset above has moved the seek pointer to just after the header, we're at the first block.
        return SeekReadStreamToBlockHelper(blockType, bytesInBlock);
    }